

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram.c
# Opt level: O1

int NgramBuilder_serialize(NgramBuilder builder,Serializer serializer,void *param)

{
  size_t *psVar1;
  byte bVar2;
  byte *pbVar3;
  char **ppcVar4;
  uint32_t *puVar5;
  uint32_t model_order;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  BuilderGram_T *gram;
  ulong uVar9;
  size_t sVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  undefined1 local_368 [8];
  size_t next_order_offsets [64];
  BuilderGram_T local_160;
  size_t local_50;
  size_t vocab_mem_size;
  Serializer local_40;
  uint32_t *local_38;
  
  if (builder->order != 0) {
    lVar6 = 0;
    do {
      if (builder->added_gram_nums[lVar6] != builder->gram_nums[lVar6]) {
        __assert_fail("builder->added_gram_nums[i] == builder->gram_nums[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c"
                      ,0x261,"int NgramBuilder_serialize(const NgramBuilder, Serializer, void *)");
      }
      lVar6 = lVar6 + 1;
    } while (builder->order != (uint32_t)lVar6);
  }
  local_38 = &builder->order;
  (*serializer)((char *)local_38,4,param);
  if (builder->order != 0) {
    lVar6 = 0;
    uVar13 = 0;
    do {
      (*serializer)((char *)((long)builder->gram_nums + lVar6),8,param);
      uVar13 = uVar13 + 1;
      lVar6 = lVar6 + 8;
    } while (uVar13 < builder->order);
  }
  local_50 = HashVocab_serialize_size(builder->vocab);
  (*serializer)((char *)&local_50,8,param);
  HashVocab_serialize(builder->vocab,serializer,param);
  qsort(builder->ngram_offsets,builder->added_total_gram_num,8,ngram_sort_cmp);
  uVar13 = (ulong)builder->order;
  if (uVar13 == 1) {
    if (*builder->gram_nums != 0) {
      uVar13 = 0;
      do {
        pbVar3 = (byte *)builder->ngram_offsets[uVar13];
        bVar2 = *pbVar3;
        next_order_offsets[0x20]._4_4_ = bVar2 & 0x3f;
        lVar6 = 1;
        if ((bVar2 & 0x3f) != 0) {
          uVar7 = 0;
          do {
            *(undefined4 *)((long)next_order_offsets + uVar7 * 4 + -4) =
                 *(undefined4 *)(pbVar3 + lVar6);
            lVar6 = lVar6 + 4;
            uVar7 = uVar7 + 1;
          } while (uVar7 < next_order_offsets[0x20]._4_4_);
        }
        next_order_offsets[0x20]._0_4_ = 0;
        if ((bVar2 & 0x40) != 0) {
          next_order_offsets[0x20]._0_4_ = *(undefined4 *)(pbVar3 + lVar6 + 4);
        }
        next_order_offsets[0x1f]._4_4_ = *(undefined4 *)(pbVar3 + lVar6);
        local_368._0_4_ = 0xffffffff;
        serialize_builder_gram((BuilderGram_T *)local_368,builder->order,serializer,param);
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (uVar13 < *builder->gram_nums);
    }
    gram = (BuilderGram_T *)local_368;
    next_order_offsets._252_8_ = 0xffffffffffffffff;
    model_order = *local_38;
  }
  else {
    local_368._0_4_ = 0;
    local_368._4_4_ = 0;
    if (uVar13 != 0) {
      ppcVar4 = builder->ngram_offsets;
      lVar6 = builder->added_total_gram_num - 1;
      uVar7 = 1;
      do {
        sVar10 = 0;
        lVar11 = lVar6;
        if (-1 < lVar6) {
          do {
            uVar9 = lVar11 + sVar10 >> 1;
            if (uVar7 < ((byte)*ppcVar4[uVar9] & 0x3f)) {
              lVar11 = uVar9 - 1;
            }
            else {
              sVar10 = uVar9 + 1;
            }
          } while ((long)sVar10 <= lVar11);
        }
        next_order_offsets[uVar7 - 1] = sVar10;
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar13);
    }
    next_order_offsets[uVar13 - 1] = builder->added_total_gram_num;
    local_160.order = builder->order;
    if (1 < local_160.order) {
      local_40 = serializer;
      vocab_mem_size = (size_t)param;
      uVar7 = 1;
      uVar13 = 0;
      do {
        uVar9 = next_order_offsets[uVar7 - 1];
        for (; iVar12 = (int)uVar9, uVar13 < uVar9; uVar13 = uVar13 + 1) {
          ppcVar4 = builder->ngram_offsets;
          pbVar3 = (byte *)ppcVar4[uVar13];
          bVar2 = *pbVar3;
          local_160.order = bVar2 & 0x3f;
          lVar6 = 1;
          if ((bVar2 & 0x3f) != 0) {
            uVar8 = 0;
            do {
              local_160.wids[uVar8] = *(uint32_t *)(pbVar3 + lVar6);
              lVar6 = lVar6 + 4;
              uVar8 = uVar8 + 1;
            } while (uVar8 < local_160.order);
          }
          local_160.bow = 0;
          if ((bVar2 & 0x40) != 0) {
            local_160.bow = *(uint32_t *)(pbVar3 + lVar6 + 4);
          }
          local_160.prob = *(uint32_t *)(pbVar3 + lVar6);
          if (uVar7 != local_160.order) {
            __assert_fail("cur_gram.order == cur_order",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/chenkovsky[P]ngram/ngram.c"
                          ,0x28c,
                          "int NgramBuilder_serialize(const NgramBuilder, Serializer, void *)");
          }
          sVar10 = _bsearch_prefix_start(ppcVar4,builder->added_total_gram_num,&local_160);
          local_160.next_arr_idx = (int)sVar10 - iVar12;
          serialize_builder_gram(&local_160,builder->order,local_40,(void *)vocab_mem_size);
        }
        local_160.wids[uVar7 - 1] = 0xffffffff;
        puVar5 = local_38;
        local_160.order = (uint32_t)uVar7;
        local_160.prob = 0xffffffff;
        local_160.bow = 0xffffffff;
        psVar1 = next_order_offsets + uVar7;
        uVar7 = uVar7 + 1;
        local_160.next_arr_idx = (int)*psVar1 - iVar12;
        serialize_builder_gram(&local_160,*local_38,local_40,(void *)vocab_mem_size);
        local_160.order = *puVar5;
        param = (void *)vocab_mem_size;
        serializer = local_40;
      } while (uVar7 < local_160.order);
    }
    if (local_160.order < 2) {
      return 0;
    }
    uVar13 = (ulong)(uint)next_order_offsets[(ulong)(local_160.order - 1) - 1];
    if (uVar13 < builder->added_total_gram_num) {
      do {
        pbVar3 = (byte *)builder->ngram_offsets[uVar13];
        bVar2 = *pbVar3;
        local_160.order = bVar2 & 0x3f;
        lVar6 = 1;
        if ((bVar2 & 0x3f) != 0) {
          uVar7 = 0;
          do {
            local_160.wids[uVar7] = *(uint32_t *)(pbVar3 + lVar6);
            lVar6 = lVar6 + 4;
            uVar7 = uVar7 + 1;
          } while (uVar7 < local_160.order);
        }
        local_160.bow = 0;
        if ((bVar2 & 0x40) != 0) {
          local_160.bow = *(uint32_t *)(pbVar3 + lVar6 + 4);
        }
        local_160.prob = *(uint32_t *)(pbVar3 + lVar6);
        local_160.next_arr_idx = 0xffffffff;
        serialize_builder_gram(&local_160,builder->order,serializer,param);
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (uVar13 < builder->added_total_gram_num);
    }
    gram = &local_160;
    local_160.prob = 0xffffffff;
    local_160.bow = 0xffffffff;
    model_order = *local_38;
    local_160.wids[model_order - 1] = 0xffffffff;
  }
  serialize_builder_gram(gram,model_order,serializer,param);
  return 0;
}

Assistant:

int NgramBuilder_serialize(const NgramBuilder builder, Serializer serializer, void* param){
    for (uint32_t i = 0;i<builder->order;i++) {
        assert(builder->added_gram_nums[i] == builder->gram_nums[i]);
    }
    serializer((char*)&builder->order,sizeof(uint32_t), param);
    for (uint32_t i = 0; i < builder->order;i++) {
        serializer((char*)&builder->gram_nums[i],sizeof(size_t), param);
    }
    size_t vocab_mem_size = HashVocab_serialize_size(builder->vocab);
    //printf("serialize vocab_mem_size:%zu\n", vocab_mem_size);
    serializer((char*)&vocab_mem_size,sizeof(vocab_mem_size), param);
    HashVocab_serialize(builder->vocab, serializer, param);

    qsort(builder->ngram_offsets, builder->added_total_gram_num, sizeof(char*), ngram_sort_cmp);
    //now sorted by order, wordids
    //print_ngrams(builder->ngram_offsets, builder->added_total_gram_num);

    if (builder->order == 1) {
        BuilderGram_T gram;
        for (uint32_t i = 0;i< builder->gram_nums[0];i++) {
            _decode_builder_gram(&gram, builder->ngram_offsets[i]);
            gram.next_arr_idx = -1;
            serialize_builder_gram(&gram, builder->order, serializer ,param);
        }
        gram.bow = -1;
        gram.prob = -1;
        serialize_builder_gram(&gram, builder->order, serializer, param);//pivot.
        return 0;
    }
    size_t cur_offset = 0;
    size_t next_order_offsets[MAX_ORDER];
    next_order_offsets[0] = 0;
    for (uint32_t cur_order = 1; cur_order< builder->order;cur_order++) {
        next_order_offsets[cur_order] = _bsearch_order_start(builder->ngram_offsets, builder->added_total_gram_num, cur_order+1);
        //printf("serialize: next_order_offsets[%d]= %zu\n", cur_order, next_order_offsets[cur_order]);
    }

    next_order_offsets[builder->order] = builder->added_total_gram_num;

    for (uint32_t cur_order = 1; cur_order < builder->order; cur_order++) {
        BuilderGram_T cur_gram;
        while (cur_offset < next_order_offsets[cur_order]) {
            _decode_builder_gram(&cur_gram, builder->ngram_offsets[cur_offset]);
            //printf("cur_order:%d\n", cur_order);
            //printf("cur_gram.order:%d\n", cur_gram.order);
            assert(cur_gram.order == cur_order);
            cur_gram.next_arr_idx = _bsearch_prefix_start(builder->ngram_offsets, builder->added_total_gram_num, &cur_gram) - next_order_offsets[cur_order];
            //if (cur_order == 1) {
            //    printf("id:%d\t", cur_offset);
            //}
            serialize_builder_gram(&cur_gram, builder->order, serializer, param); 
            cur_offset += 1;
        }
        cur_gram.wids[cur_order-1] = -1;
        cur_gram.order = cur_order;
        cur_gram.prob = -1;
        cur_gram.bow = -1;
        cur_gram.next_arr_idx = next_order_offsets[cur_order+1] - next_order_offsets[cur_order];
        serialize_builder_gram(&cur_gram, builder->order, serializer, param);
    }
    if (builder->order > 1) {
        BuilderGram_T gram;
        gram.order = builder->order;
        for (uint32_t i =  next_order_offsets[builder->order-1];i< builder->added_total_gram_num;i++) {
            _decode_builder_gram(&gram, builder->ngram_offsets[i]);
            gram.next_arr_idx = -1;
            serialize_builder_gram(&gram, builder->order, serializer, param);
        }
        gram.bow = -1;
        gram.prob = -1;
        gram.wids[builder->order-1] = -1;
        serialize_builder_gram(&gram, builder->order, serializer, param);//pivot.
    }
    return 0; 
}